

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmstr.cpp
# Opt level: O0

int CVmObjString::getp_match(vm_val_t *retval,vm_val_t *self_val,char *str,uint *argc)

{
  vm_globalvar_t *pvVar1;
  int iVar2;
  int32_t iVar3;
  size_t sVar4;
  vm_val_t *pvVar5;
  CVmObject *pCVar6;
  size_t sVar7;
  re_compiled_pattern *entirestr;
  uint *in_RCX;
  long in_RDX;
  undefined8 *in_RSI;
  vm_val_t *in_RDI;
  int matchlen;
  re_compiled_pattern *cpat;
  int32_t i;
  utf8_ptr strp;
  int32_t start_idx;
  size_t targstrlen;
  CVmObjPattern *targpat;
  char *targstr;
  vm_val_t *targ;
  char *basestr;
  size_t len;
  uint orig_argc;
  undefined4 in_stack_ffffffffffffff58;
  undefined4 in_stack_ffffffffffffff5c;
  CVmObject *in_stack_ffffffffffffff60;
  uint n;
  uint uVar8;
  undefined4 in_stack_ffffffffffffff6c;
  utf8_ptr *in_stack_ffffffffffffff70;
  undefined4 in_stack_ffffffffffffff78;
  int in_stack_ffffffffffffff7c;
  utf8_ptr in_stack_ffffffffffffff80;
  ulong local_70;
  char *local_60;
  char *local_20;
  
  if (in_RCX == (uint *)0x0) {
    n = 0;
  }
  else {
    n = *in_RCX;
  }
  uVar8 = n;
  if ((getp_match(vm_val_t*,vm_val_t_const*,char_const*,unsigned_int*)::desc == '\0') &&
     (iVar2 = __cxa_guard_acquire(&getp_match(vm_val_t*,vm_val_t_const*,char_const*,unsigned_int*)::
                                   desc), iVar2 != 0)) {
    CVmNativeCodeDesc::CVmNativeCodeDesc(&getp_match::desc,1,1);
    __cxa_guard_release(&getp_match(vm_val_t*,vm_val_t_const*,char_const*,unsigned_int*)::desc);
  }
  iVar2 = CVmObject::get_prop_check_argc
                    ((vm_val_t *)CONCAT44(in_stack_ffffffffffffff6c,uVar8),
                     (uint *)in_stack_ffffffffffffff60,
                     (CVmNativeCodeDesc *)
                     CONCAT44(in_stack_ffffffffffffff5c,in_stack_ffffffffffffff58));
  if (iVar2 != 0) {
    return 1;
  }
  sVar4 = vmb_get_len((char *)0x33cf4a);
  local_20 = (char *)(in_RDX + 2);
  pvVar5 = CVmStack::get(0);
  local_70 = 0;
  local_60 = vm_val_t::get_as_string
                       ((vm_val_t *)CONCAT44(in_stack_ffffffffffffff5c,in_stack_ffffffffffffff58));
  if (local_60 == (char *)0x0) {
    if (pvVar5->typ == VM_OBJ) {
      pCVar6 = vm_objp(0);
      iVar2 = (*pCVar6->_vptr_CVmObject[1])(pCVar6,CVmObjPattern::metaclass_reg_);
      if (iVar2 == 0) goto LAB_0033d010;
      in_stack_ffffffffffffff60 = vm_objp(0);
    }
    else {
LAB_0033d010:
      in_stack_ffffffffffffff60 = (CVmObject *)0x0;
    }
    if (in_stack_ffffffffffffff60 == (CVmObject *)0x0) {
      err_throw(0);
    }
    local_60 = (char *)0x0;
  }
  else {
    local_70 = vmb_get_len((char *)0x33cfb8);
    local_60 = local_60 + 2;
  }
  if ((1 < n) && (pvVar5 = CVmStack::get(1), pvVar5->typ != VM_NIL)) {
    CVmStack::get(1);
    iVar3 = vm_val_t::num_to_int((vm_val_t *)in_stack_ffffffffffffff60);
    utf8_ptr::utf8_ptr((utf8_ptr *)in_stack_ffffffffffffff60,
                       (char *)CONCAT44(in_stack_ffffffffffffff5c,in_stack_ffffffffffffff58));
    if (iVar3 < 0) {
      sVar7 = utf8_ptr::len((utf8_ptr *)in_stack_ffffffffffffff60,
                            CONCAT44(in_stack_ffffffffffffff5c,in_stack_ffffffffffffff58));
      iVar2 = (int)sVar7;
    }
    else {
      iVar2 = -1;
    }
    in_stack_ffffffffffffff7c = 0;
    while (in_stack_ffffffffffffff7c < iVar2 + iVar3 && local_70 < sVar4) {
      in_stack_ffffffffffffff7c = in_stack_ffffffffffffff7c + 1;
      utf8_ptr::inc(in_stack_ffffffffffffff70,(size_t *)CONCAT44(in_stack_ffffffffffffff6c,uVar8));
    }
    if (in_stack_ffffffffffffff7c < iVar2 + iVar3) {
      vm_val_t::set_nil(in_RDI);
      goto LAB_0033d22e;
    }
    local_20 = utf8_ptr::getptr((utf8_ptr *)&stack0xffffffffffffff80);
  }
  if (local_60 == (char *)0x0) {
    entirestr = CVmObjPattern::get_pattern((CVmObjPattern *)0x33d199);
    pvVar1 = G_bif_tads_globals_X->last_rex_str;
    *(undefined8 *)&pvVar1->val = *in_RSI;
    (pvVar1->val).val = *(anon_union_8_8_cb74652f_for_val *)(in_RSI + 1);
    CRegexSearcherSimple::clear_group_regs((CRegexSearcherSimple *)0x33d1d5);
    iVar2 = CRegexSearcherSimple::match_pattern
                      ((CRegexSearcherSimple *)in_stack_ffffffffffffff80.p_,
                       (re_compiled_pattern *)
                       CONCAT44(in_stack_ffffffffffffff7c,in_stack_ffffffffffffff78),
                       (char *)entirestr,(char *)CONCAT44(in_stack_ffffffffffffff6c,uVar8),
                       (size_t)in_stack_ffffffffffffff60);
    if (iVar2 < 0) {
      vm_val_t::set_nil(in_RDI);
    }
    else {
      vm_val_t::set_int(in_RDI,iVar2);
    }
  }
  else if ((sVar4 < local_70) || (iVar2 = memcmp(local_60,local_20,local_70), iVar2 != 0)) {
    vm_val_t::set_nil(in_RDI);
  }
  else {
    vm_val_t::set_int(in_RDI,(int32_t)local_70);
  }
LAB_0033d22e:
  CVmStack::discard(n);
  return 1;
}

Assistant:

int CVmObjString::getp_match(VMG_ vm_val_t *retval,
                             const vm_val_t *self_val, const char *str,
                             uint *argc)
{
    /* check arguments */
    uint orig_argc = (argc != 0 ? *argc : 0);
    static CVmNativeCodeDesc desc(1, 1);
    if (get_prop_check_argc(retval, argc, &desc))
        return TRUE;

    /* get the string length and buffer pointer */
    size_t len = vmb_get_len(str);
    str += VMB_LEN;

    /* remember the base string */
    const char *basestr = str;
    
    /* retrieve the string or regex pattern to match */
    vm_val_t *targ = G_stk->get(0);
    const char *targstr = 0;
    CVmObjPattern *targpat = 0;
    size_t targstrlen = 0;
    if ((targstr = targ->get_as_string(vmg0_)) != 0)
    {
        /* it's a literal string - get its length and text pointer */
        targstrlen = vmb_get_len(targstr);
        targstr += VMB_LEN;
    }
    else if ((targpat = vm_val_cast(CVmObjPattern, targ)) != 0)
    {
        /* it's a pattern */
    }
    else
    {
        /* we need a string or a pattern; other values are invalid */
        err_throw(VMERR_BAD_TYPE_BIF);
    }

    /* retrieve the starting index, if present */
    int32_t start_idx = 0;
    if (orig_argc >= 2 && G_stk->get(1)->typ != VM_NIL)
    {
        /* get the starting index value */
        start_idx = G_stk->get(1)->num_to_int(vmg0_);

        /* set up a UTF-8 pointer for traversing the string */
        utf8_ptr strp((char *)str);

        /*
         *   A positive index value is a 1-based index from the start of the
         *   string.  A negative index is from the end of the string, with -1
         *   pointing to the last character. 
         */
        start_idx += (start_idx < 0 ? (int)strp.len(len) : -1);

        /* skip that many characters */
        int32_t i;
        for (i = 0 ; i < start_idx && len > targstrlen ; ++i, strp.inc(&len)) ;

        /* 
         *   if the start index was past the end of the string (or past the
         *   point where the remaining subject string is too short for the
         *   target string), we definitely can't match 
         */
        if (i < start_idx)
        {
            retval->set_nil();
            goto done;
        }

        /* start the search here */
        str = strp.getptr();
    }

    /* match the string or pattern */
    if (targstr != 0)
    {
        /* make sure it's long enough, then match the text literally */
        if (len >= targstrlen && memcmp(targstr, str, targstrlen) == 0)
        {
            /* matched - return the match length */
            retval->set_int(targstrlen);
        }
        else
        {
            /* no match */
            retval->set_nil();
        }
    }
    else
    {
        /* RexPattern - get the compiled pattern */
        re_compiled_pattern *cpat = targpat->get_pattern(vmg0_);

        /* save the last search source string */
        G_bif_tads_globals->last_rex_str->val = *self_val;
        G_bif_tads_globals->rex_searcher->clear_group_regs();

        /* match the pattern */
        int matchlen = G_bif_tads_globals->rex_searcher->match_pattern(
            cpat, basestr, str, len);

        /* if it matched (len >= 0), return the length, otherwise nil */
        if (matchlen >= 0)
            retval->set_int(matchlen);
        else
            retval->set_nil();
    }

done:
    /* discard arguments */
    G_stk->discard(orig_argc);

    /* handled */
    return TRUE;
}